

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  int iVar1;
  int a;
  int iVar2;
  void *__s;
  stbi_uc *psVar3;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int in_R8D;
  undefined8 in_R9;
  int internal_comp;
  int y;
  int x;
  int i;
  stbi_uc *result;
  undefined4 in_stack_00000028;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_44;
  int in_stack_ffffffffffffffd0;
  uchar *local_8;
  
  if (in_RCX == (int *)0x0) {
    in_RCX = (int *)&stack0xffffffffffffffb0;
  }
  for (local_44 = 0; local_44 < 0x5c; local_44 = local_44 + 1) {
    stbi__get8((stbi__context *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  iVar1 = stbi__get16be((stbi__context *)
                        CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  a = stbi__get16be((stbi__context *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  iVar2 = stbi__at_eof((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (iVar2 == 0) {
    iVar2 = stbi__mad3sizes_valid
                      (a,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                       in_stack_ffffffffffffffa8);
    if (iVar2 == 0) {
      stbi__err("too large");
      local_8 = (uchar *)0x0;
    }
    else {
      stbi__get32be((stbi__context *)CONCAT44(a,in_stack_ffffffffffffffb0));
      stbi__get16be((stbi__context *)CONCAT44(a,in_stack_ffffffffffffffb0));
      stbi__get16be((stbi__context *)CONCAT44(a,in_stack_ffffffffffffffb0));
      __s = stbi__malloc_mad3(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0,0x1a2c12);
      memset(__s,0xff,(long)(iVar1 * a * 4));
      psVar3 = stbi__pic_load_core((stbi__context *)py,comp._4_4_,(int)comp,
                                   (int *)CONCAT44(req_comp,in_stack_00000028),(stbi_uc *)ri);
      if (psVar3 == (stbi_uc *)0x0) {
        free(__s);
      }
      *in_RSI = iVar1;
      *in_RDX = a;
      if (in_R8D == 0) {
        in_R8D = *in_RCX;
      }
      local_8 = stbi__convert_format
                          ((uchar *)in_RCX,in_R8D,in_stack_ffffffffffffffd0,
                           (uint)((ulong)in_R9 >> 0x20),(uint)in_R9);
    }
  }
  else {
    stbi__err("bad file");
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);
   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}